

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbvthandler_p.cpp
# Opt level: O2

void QFbVtHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>
                      ((QtMocHelpers *)_a,(void **)interrupted,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>
                          ((QtMocHelpers *)_a,(void **)aboutToSuspend,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>((QtMocHelpers *)_a,(void **)resumed,0,2);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      interrupted((QFbVtHandler *)_o);
      return;
    case 1:
      aboutToSuspend((QFbVtHandler *)_o);
      return;
    case 2:
      resumed((QFbVtHandler *)_o);
      return;
    case 3:
      handleSignal((QFbVtHandler *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QFbVtHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbVtHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->interrupted(); break;
        case 1: _t->aboutToSuspend(); break;
        case 2: _t->resumed(); break;
        case 3: _t->handleSignal(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::interrupted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::aboutToSuspend, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::resumed, 2))
            return;
    }
}